

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

Result __thiscall
tonk::HostnameResolverState::GetNextServerAddress(HostnameResolverState *this,address *addr)

{
  uint32_t uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  long lVar7;
  undefined8 *in_RDX;
  Result *success;
  ulong uVar8;
  uint uVar9;
  bad_address_cast ex;
  undefined **local_38;
  long local_30;
  undefined1 local_28 [16];
  
  uVar2 = *(unsigned_long *)((long)&(addr->ipv6_address_).addr_.__in6_u + 8);
  uVar3 = (addr->ipv6_address_).scope_id_;
  if (uVar2 == uVar3) {
    local_38 = (undefined **)local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Hostname did not resolve","");
    puVar6 = (undefined8 *)operator_new(0x38);
    *puVar6 = "Connection failed";
    puVar6[1] = puVar6 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar6 + 1),local_38,(undefined1 *)((long)local_38 + local_30));
  }
  else {
    uVar1 = addr[1].ipv6_address_.addr_.__in6_u.__u6_addr32[1];
    uVar8 = 0;
    uVar9 = addr[1].ipv6_address_.addr_.__in6_u.__u6_addr32[0] + 1;
    if (uVar9 < (uint)(uVar3 - uVar2 >> 5)) {
      uVar8 = (ulong)uVar9;
    }
    addr[1].ipv6_address_.addr_.__in6_u.__u6_addr32[0] = (uint32_t)uVar8;
    if (uVar1 != 0) {
      addr[1].ipv6_address_.addr_.__in6_u.__u6_addr32[1] = uVar1 - 1;
      lVar7 = uVar8 * 0x20;
      uVar4 = *(undefined8 *)(uVar2 + lVar7);
      *in_RDX = uVar4;
      puVar6 = (undefined8 *)(uVar2 + 8 + lVar7);
      uVar5 = puVar6[1];
      in_RDX[1] = *puVar6;
      in_RDX[2] = uVar5;
      in_RDX[3] = *(undefined8 *)(uVar2 + 0x18 + lVar7);
      if ((int)uVar4 == 0) {
        *(undefined8 *)this = 0;
        return (Result)(ErrorResult *)this;
      }
      if (*(undefined1 (*) [16])(in_RDX + 1) == _DAT_00192760) {
        *in_RDX = 0x100007f00000000;
        in_RDX[3] = 0;
        *(undefined1 (*) [16])(in_RDX + 1) = (undefined1  [16])0x0;
        *(undefined8 *)this = 0;
        return (Result)(ErrorResult *)this;
      }
      local_38 = &PTR__bad_cast_001b6fa0;
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__bad_cast_001b6fa0;
      __cxa_throw(puVar6,&asio::ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    local_38 = (undefined **)local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"No servers responded","");
    puVar6 = (undefined8 *)operator_new(0x38);
    *puVar6 = "Connection failed";
    puVar6[1] = puVar6 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar6 + 1),local_38,(undefined1 *)((long)local_38 + local_30));
  }
  *(undefined4 *)(puVar6 + 5) = 0;
  puVar6[6] = 0xb;
  *(undefined8 **)this = puVar6;
  if (local_38 != (undefined **)local_28) {
    operator_delete(local_38);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result HostnameResolverState::GetNextServerAddress(asio::ip::address& addr)
{
    // If there are no TCP addresses resolved:
    if (ResolvedIPAddresses.empty()) {
        return Result("Connection failed", "Hostname did not resolve", ErrorType::Tonk, Tonk_ConnectionTimeout);
    }

    // Try the next connection address
    if (++ConnectAddrIndex >= static_cast<unsigned>(ResolvedIPAddresses.size())) {
        ConnectAddrIndex = 0;
    }

    // Try once per server in the list
    if (ConnectRequestsRemaining <= 0) {
        return Result("Connection failed", "No servers responded", ErrorType::Tonk, Tonk_ConnectionTimeout);
    }
    --ConnectRequestsRemaining;

    addr = ResolvedIPAddresses[ConnectAddrIndex];
    if (addr.is_v4()) {
        return Result::Success();
    }

    try
    {
        // Workaround fix: IPv6 loopback is not handled properly by asio to_v4()
        if (addr.is_loopback())
        {
            addr = asio::ip::address_v4::loopback();
            return Result::Success();
        }

        addr = addr.to_v4();
    }
    catch (...)
    {
    }

    // Unable to convert, keep as IPv6
    return Result::Success();
}